

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  int count;
  LogMessageFatal LStack_18;
  
  if (this->buffer_end_ + 0x10 < ptr) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x6e,"ptr <= buffer_end_ + kSlopBytes");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
  }
  if (this->next_chunk_ == this->patch_buffer_) {
    count = BytesAvailable(this,ptr);
  }
  else {
    count = ((int)this->buffer_end_ - (int)ptr) + this->size_;
  }
  if (0 < count) {
    StreamBackUp(this,count);
    return;
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = BytesAvailable(ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }